

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  float fVar1;
  float fVar3;
  ImVec2 IVar2;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 size_expected;
  ImVec2 local_30;
  ImVec2 local_28;
  undefined8 uStack_20;
  
  fVar4 = (window->Pos).x;
  fVar8 = (window->Size).x + fVar4;
  fVar6 = (window->Pos).y;
  fVar9 = (window->Size).y + fVar6;
  fVar1 = (*corner_target).x;
  fVar3 = (*corner_target).y;
  fVar5 = (*corner_norm).x;
  fVar7 = (*corner_norm).y;
  local_30.x = (fVar4 - fVar1) * fVar5 + fVar1;
  local_30.y = (fVar6 - fVar3) * fVar7 + fVar3;
  local_28.y = local_30.y;
  local_28.x = local_30.x;
  uStack_20 = 0;
  local_30.x = ((fVar1 - fVar8) * fVar5 + fVar8) - local_30.x;
  local_30.y = ((fVar3 - fVar9) * fVar7 + fVar9) - local_30.y;
  IVar2 = CalcWindowSizeAfterConstraint(window,&local_30);
  *out_pos = local_28;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    out_pos->x = out_pos->x - (IVar2.x - local_30.x);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    out_pos->y = out_pos->y - (IVar2.y - local_30.y);
  }
  *out_size = IVar2;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}